

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_CreateStringArray(char **strings,int count)

{
  cJSON *c;
  cJSON *pcVar1;
  ulong uVar2;
  cJSON *pcVar3;
  bool bVar4;
  
  c = (cJSON *)(*cJSON_malloc)(0x40);
  if (c != (cJSON *)0x0) {
    c->child = (cJSON *)0x0;
    *(undefined8 *)&c->type = 0;
    c->valuedouble = 0.0;
    c->string = (char *)0x0;
    c->valuestring = (char *)0x0;
    *(undefined8 *)&c->valueint = 0;
    c->next = (cJSON *)0x0;
    c->prev = (cJSON *)0x0;
    c->type = 0x20;
  }
  if (0 < count && c != (cJSON *)0x0) {
    uVar2 = 1;
    pcVar3 = (cJSON *)0x0;
    while (pcVar1 = cJSON_CreateString(strings[uVar2 - 1]), pcVar1 != (cJSON *)0x0) {
      if (uVar2 == 1) {
        c->child = pcVar1;
      }
      else {
        pcVar3->next = pcVar1;
        pcVar1->prev = pcVar3;
      }
      if (c == (cJSON *)0x0) {
        return (cJSON *)0x0;
      }
      bVar4 = (uint)count <= uVar2;
      uVar2 = uVar2 + 1;
      pcVar3 = pcVar1;
      if (bVar4) {
        return c;
      }
    }
    cJSON_Delete(c);
    c = (cJSON *)0x0;
  }
  return c;
}

Assistant:

cJSON *cJSON_CreateStringArray(const char **strings,int count)	{int i;cJSON *n=0,*p=0,*a=cJSON_CreateArray();for(i=0;a && i<count;i++){n=cJSON_CreateString(strings[i]);if(!n){cJSON_Delete(a);return 0;}if(!i)a->child=n;else suffix_object(p,n);p=n;}return a;}